

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

bool_t derIsValid(octet *der,size_t count)

{
  bool_t bVar1;
  size_t in_RAX;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  size_t len;
  size_t local_28;
  
  uVar4 = 0;
  local_28 = in_RAX;
  sVar2 = derTDec((u32 *)0x0,der,count);
  if (sVar2 != 0xffffffffffffffff) {
    sVar3 = derLDec(&local_28,der + sVar2,count - sVar2);
    if ((sVar3 != 0xffffffffffffffff) && (sVar2 + sVar3 + local_28 == count)) {
      bVar1 = memIsValid(der + sVar2 + sVar3,local_28);
      uVar4 = (uint)(bVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

bool_t derIsValid(const octet der[], size_t count)
{
	size_t t_count;
	size_t l_count;
	size_t len;
	// обработать T
	t_count = derTDec(0, der, count);
	if (t_count == SIZE_MAX)
		return FALSE;
	// обработать L
	l_count = derLDec(&len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return FALSE;
	// проверить V
	return count == t_count + l_count + len &&
		memIsValid(der + t_count + l_count, len);
}